

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::gray_convert(jpeg_decoder *this)

{
  uint8 *puVar1;
  uint8 *puVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  if (0 < this->m_max_mcus_per_row) {
    iVar4 = this->m_max_mcu_y_size - this->m_mcu_lines_left;
    puVar1 = this->m_pSample_buf;
    puVar2 = this->m_pScan_line_0;
    uVar3 = this->m_max_mcus_per_row + 1;
    lVar5 = 0;
    do {
      *(undefined4 *)(puVar2 + lVar5) = *(undefined4 *)(puVar1 + lVar5 * 8 + (long)(iVar4 * 8));
      *(undefined4 *)(puVar2 + lVar5 + 4) =
           *(undefined4 *)(puVar1 + lVar5 * 8 + (long)(iVar4 * 8) + 4);
      uVar3 = uVar3 - 1;
      lVar5 = lVar5 + 8;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

void jpeg_decoder::gray_convert() {
  int row = m_max_mcu_y_size - m_mcu_lines_left;
  uint8* d = m_pScan_line_0;
  uint8* s = m_pSample_buf + row * 8;

  for (int i = m_max_mcus_per_row; i > 0; i--) {
    *(uint*)d = *(uint*)s;
    *(uint*)(&d[4]) = *(uint*)(&s[4]);

    s += 64;
    d += 8;
  }
}